

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstm_x86_avx512.cpp
# Opt level: O1

void __thiscall ncnn::LSTM_x86_avx512::LSTM_x86_avx512(LSTM_x86_avx512 *this)

{
  LSTM::LSTM((LSTM *)&this->field_0xe0);
  this->_vptr_LSTM_x86_avx512 = (_func_int **)0x616da0;
  *(undefined8 *)&this->field_0xe0 = 0x616e20;
  (this->weight_hc_data_packed).cstep = 0;
  *(undefined2 *)&this->field_0xe8 = 0;
  (this->weight_xc_data_packed).data = (void *)0x0;
  (this->weight_xc_data_packed).refcount = (int *)0x0;
  *(undefined8 *)((long)&(this->weight_xc_data_packed).refcount + 4) = 0;
  *(undefined8 *)((long)&(this->weight_xc_data_packed).elemsize + 4) = 0;
  (this->weight_xc_data_packed).allocator = (Allocator *)0x0;
  (this->weight_xc_data_packed).dims = 0;
  (this->weight_xc_data_packed).w = 0;
  (this->weight_xc_data_packed).w = 0;
  (this->weight_xc_data_packed).h = 0;
  (this->weight_xc_data_packed).d = 0;
  (this->weight_xc_data_packed).c = 0;
  (this->weight_xc_data_packed).cstep = 0;
  (this->bias_c_data_packed).data = (void *)0x0;
  (this->bias_c_data_packed).refcount = (int *)0x0;
  (this->bias_c_data_packed).elemsize = 0;
  (this->bias_c_data_packed).elempack = 0;
  (this->bias_c_data_packed).allocator = (Allocator *)0x0;
  (this->bias_c_data_packed).dims = 0;
  (this->bias_c_data_packed).w = 0;
  (this->bias_c_data_packed).w = 0;
  (this->bias_c_data_packed).h = 0;
  (this->bias_c_data_packed).d = 0;
  (this->bias_c_data_packed).c = 0;
  (this->bias_c_data_packed).cstep = 0;
  (this->weight_hc_data_packed).data = (void *)0x0;
  (this->weight_hc_data_packed).refcount = (int *)0x0;
  (this->weight_hc_data_packed).elemsize = 0;
  (this->weight_hc_data_packed).elempack = 0;
  (this->weight_hc_data_packed).w = 0;
  (this->weight_hc_data_packed).h = 0;
  (this->weight_hc_data_packed).d = 0;
  (this->weight_hc_data_packed).c = 0;
  (this->weight_hc_data_packed).allocator = (Allocator *)0x0;
  (this->weight_hc_data_packed).dims = 0;
  (this->weight_hc_data_packed).w = 0;
  return;
}

Assistant:

LSTM_x86_avx512::LSTM_x86_avx512()
{
    one_blob_only = false;
    support_inplace = false;
}